

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O1

void printBasic(XSObject *xsObject,char *type)

{
  char *in_RAX;
  wchar16 *pwVar1;
  char *pcVar2;
  size_t sVar3;
  StrX local_28;
  
  local_28.fLocalForm = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name:\t\t\t",8);
  pwVar1 = (wchar16 *)(**(code **)(*(long *)xsObject + 0x18))(xsObject);
  if ((pwVar1 != (wchar16 *)0x0) && (*pwVar1 != L'\0')) {
    pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_28.fLocalForm = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    StrX::~StrX(&local_28);
  }
  pwVar1 = (wchar16 *)(**(code **)(*(long *)xsObject + 0x10))(xsObject);
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28.fLocalForm = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  StrX::~StrX(&local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Component Type:\t",0x10)
  ;
  if (type == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
  }
  else {
    sVar3 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,type,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void printBasic(XSObject *xsObject, const char *type)
{
    std::cout << "Name:\t\t\t";
    const XMLCh *nameSpace = xsObject->getNamespace();
    if (nameSpace && *nameSpace) {
        std::cout << StrX(nameSpace) << ", ";
    }
    std::cout << StrX(xsObject->getName()) << "\n";
    std::cout << "Component Type:\t" << type << std::endl;
}